

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_conv_transpose_2d(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  undefined2 *puVar7;
  undefined2 *puVar8;
  size_t __n;
  char *pcVar9;
  int iVar10;
  int64_t i02;
  ulong uVar11;
  ulong uVar12;
  int i00_1;
  undefined2 *puVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  undefined8 uVar17;
  ulong uVar18;
  undefined2 *puVar19;
  ulong uVar20;
  int i11;
  void *pvVar21;
  ggml_fp16_t *y;
  long lVar22;
  int64_t i00;
  long lVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  long local_108;
  ulong local_f8;
  long local_f0;
  ggml_fp16_t *local_e8;
  ulong local_e0;
  float v;
  undefined2 *local_d0;
  ggml_tensor *local_c8;
  size_t local_c0;
  ulong local_b8;
  ggml_compute_params *local_b0;
  void *local_a8;
  ulong local_a0;
  int64_t local_98;
  size_t local_90;
  size_t local_88;
  ulong local_80;
  undefined2 *local_78;
  long local_70;
  int64_t local_68;
  ulong local_60;
  ulong local_58;
  ggml_fp16_t *local_50;
  ulong local_48;
  size_t local_40;
  ulong local_38;
  
  pgVar1 = dst->src[0];
  if (pgVar1->type == GGML_TYPE_F16) {
    pgVar2 = dst->src[1];
    if (pgVar2->type == GGML_TYPE_F32) {
      if (dst->type == GGML_TYPE_F32) {
        if (pgVar1->nb[0] == 2) {
          if (pgVar2->nb[0] == 4) {
            local_98 = dst->ne[2];
            uVar18 = pgVar1->ne[3];
            uVar14 = pgVar1->ne[0];
            uVar3 = pgVar1->ne[1];
            uVar4 = pgVar1->ne[2];
            local_68 = dst->ne[0];
            local_b8 = pgVar2->ne[0];
            local_a0 = pgVar2->ne[2];
            iVar10 = params->ith;
            local_f8 = pgVar2->ne[1];
            local_a8 = (void *)(ulong)(uint)params->nth;
            lVar23 = uVar18 * uVar14;
            local_40 = dst->nb[2];
            local_c8 = dst;
            local_70 = lVar23;
            local_38 = uVar18;
            if (iVar10 == 0) {
              local_90 = pgVar1->nb[3];
              local_50 = (ggml_fp16_t *)pgVar1->nb[2];
              local_c0 = pgVar2->nb[1];
              local_88 = pgVar2->nb[2];
              memset(params->wdata,0,params->wsize);
              dst = local_c8;
              local_d0 = (undefined2 *)params->wdata;
              local_48 = ~((long)uVar14 >> 0x3f) & uVar14;
              local_60 = ~((long)uVar3 >> 0x3f) & uVar3;
              puVar8 = local_d0;
              uVar12 = 0;
              lVar16 = 0;
              while (lVar22 = lVar16, uVar11 = uVar12, puVar7 = puVar8,
                    uVar11 != (~((long)uVar18 >> 0x3f) & uVar18)) {
                puVar8 = puVar7;
                lVar16 = lVar22;
                for (uVar12 = 0; uVar12 != (~((long)uVar4 >> 0x3f) & uVar4); uVar12 = uVar12 + 1) {
                  lVar15 = (long)pgVar1->data + lVar16;
                  puVar19 = puVar8;
                  for (uVar20 = 0; uVar20 != local_60; uVar20 = uVar20 + 1) {
                    puVar13 = puVar19;
                    for (uVar24 = 0; local_48 != uVar24; uVar24 = uVar24 + 1) {
                      *puVar13 = *(undefined2 *)(lVar15 + uVar24 * 2);
                      puVar13 = puVar13 + uVar18;
                    }
                    puVar19 = puVar19 + lVar23;
                    lVar15 = lVar15 + uVar14 * 2;
                  }
                  lVar16 = lVar16 + (long)local_50;
                  puVar8 = puVar8 + lVar23 * uVar3;
                }
                puVar8 = puVar7 + 1;
                lVar16 = lVar22 + local_90;
                local_80 = uVar11;
                local_78 = puVar7;
                local_58 = lVar22;
                uVar12 = uVar11 + 1;
              }
              local_e0 = ~((long)local_b8 >> 0x3f) & local_b8;
              local_f8 = ~((long)local_f8 >> 0x3f) & local_f8;
              lVar16 = 0;
              for (uVar18 = 0; uVar18 != (~((long)local_a0 >> 0x3f) & local_a0); uVar18 = uVar18 + 1
                  ) {
                lVar22 = lVar16;
                for (uVar14 = 0; uVar14 != local_f8; uVar14 = uVar14 + 1) {
                  uVar12 = 0;
                  while (local_e0 != uVar12) {
                    lVar15 = uVar12 * 4;
                    uVar12 = uVar12 + 1;
                    auVar25 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)pgVar2->data + lVar15 + lVar22)
                                                    ),0);
                    vpextrw_avx(auVar25,0);
                  }
                  lVar22 = lVar22 + local_c0;
                }
                lVar16 = lVar16 + local_88;
              }
              pvVar21 = local_c8->data;
              local_b0 = params;
              __n = ggml_nbytes(local_c8);
              memset(pvVar21,0,__n);
              params = local_b0;
            }
            else {
              local_48 = ~((long)uVar14 >> 0x3f) & uVar14;
              local_60 = ~((long)uVar3 >> 0x3f) & uVar3;
              local_e0 = ~((long)local_b8 >> 0x3f) & local_b8;
              local_f8 = ~((long)local_f8 >> 0x3f) & local_f8;
            }
            ggml_barrier(params->threadpool);
            uVar18 = local_38;
            iVar5 = (int)local_98;
            iVar6 = (iVar5 + -1 + (int)local_a8) / (int)local_a8;
            iVar10 = iVar10 * iVar6;
            iVar6 = iVar6 + iVar10;
            lVar16 = (long)iVar10;
            if (iVar5 <= iVar6) {
              iVar6 = iVar5;
            }
            lVar22 = uVar3 * local_70;
            local_a0 = local_a0 << 0x20;
            local_70 = local_70 * 2;
            local_d0 = (undefined2 *)(long)iVar6;
            pvVar21 = (void *)((long)((int)uVar3 * (int)uVar4 * (int)lVar23) * 2 +
                              (long)params->wdata);
            local_e8 = (ggml_fp16_t *)((long)params->wdata + lVar22 * lVar16 * 2);
            local_108 = local_40 * lVar16;
            lVar23 = local_68 * dst->op_params[0];
            local_b0 = (ggml_compute_params *)((long)dst->op_params[0] << 2);
            local_68 = local_68 << 2;
            local_c0 = lVar23 * 4;
            local_a8 = pvVar21;
            for (; lVar16 < (long)local_d0; lVar16 = lVar16 + 1) {
              local_f0 = (long)local_c8->data + local_108;
              local_98 = lVar16;
              for (local_88 = 0; local_88 != local_f8; local_88 = local_88 + 1) {
                local_90 = local_b8 * local_88;
                lVar23 = local_f0;
                for (local_80 = 0; local_80 != local_e0; local_80 = local_80 + 1) {
                  lVar16 = (local_90 + local_80) * local_a0;
                  y = local_e8;
                  local_78 = (undefined2 *)lVar23;
                  for (local_58 = 0; local_58 != local_60; local_58 = local_58 + 1) {
                    local_50 = y;
                    for (uVar14 = 0; local_48 != uVar14; uVar14 = uVar14 + 1) {
                      v = 0.0;
                      ggml_vec_dot_f16((int)local_38,&v,0,
                                       (ggml_fp16_t *)((lVar16 >> 0x1f) + (long)pvVar21),0,y,0,1);
                      y = y + uVar18;
                      *(float *)(lVar23 + uVar14 * 4) = v + *(float *)(lVar23 + uVar14 * 4);
                    }
                    lVar23 = lVar23 + local_68;
                    y = (ggml_fp16_t *)((long)local_50 + local_70);
                  }
                  lVar23 = (long)local_78 + (long)local_b0;
                  lVar16 = local_98;
                  pvVar21 = local_a8;
                }
                local_f0 = local_f0 + local_c0;
              }
              local_e8 = local_e8 + lVar22;
              local_108 = local_108 + local_40;
            }
            return;
          }
          pcVar9 = "nb10 == sizeof(float)";
          uVar17 = 0x1768;
        }
        else {
          pcVar9 = "nb00 == sizeof(ggml_fp16_t)";
          uVar17 = 0x1767;
        }
      }
      else {
        pcVar9 = "dst->type == GGML_TYPE_F32";
        uVar17 = 0x175e;
      }
    }
    else {
      pcVar9 = "src1->type == GGML_TYPE_F32";
      uVar17 = 0x175d;
    }
  }
  else {
    pcVar9 = "src0->type == GGML_TYPE_F16";
    uVar17 = 0x175c;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar17,"GGML_ASSERT(%s) failed",pcVar9);
}

Assistant:

void ggml_compute_forward_conv_transpose_2d(
        const ggml_compute_params * params,
              ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];
    const ggml_tensor * src1 = dst->src[1];

    GGML_ASSERT(src0->type == GGML_TYPE_F16);
    GGML_ASSERT(src1->type == GGML_TYPE_F32);
    GGML_ASSERT( dst->type == GGML_TYPE_F32);

    GGML_TENSOR_BINARY_OP_LOCALS

    const int ith = params->ith;
    const int nth = params->nth;

    const int nk = ne00*ne01*ne02*ne03;

    GGML_ASSERT(nb00 == sizeof(ggml_fp16_t));
    GGML_ASSERT(nb10 == sizeof(float));

    if (ith == 0) {
        memset(params->wdata, 0, params->wsize);

        // permute kernel data (src0) from (Kw x Kh x Cout x Cin) to (Cin x Kw x Kh x Cout)
        {
            ggml_fp16_t * const wdata = (ggml_fp16_t *) params->wdata + 0;

            for (int64_t i03 = 0; i03 < ne03; i03++) {
                for (int64_t i02 = 0; i02 < ne02; i02++) {
                    const ggml_fp16_t * const src = (ggml_fp16_t *)((char *) src0->data + i03*nb03 + i02*nb02);
                    ggml_fp16_t * dst_data = wdata + i02*ne01*ne00*ne03;
                    for (int64_t i01 = 0; i01 < ne01; i01++) {
                        for (int64_t i00 = 0; i00 < ne00; i00++) {
                            dst_data[i01*ne00*ne03 + i00*ne03 + i03] = src[i01 * ne00 + i00];
                        }
                    }
                }
            }
        }

        // permute source data (src1) from (Sw x Sh x Cin) to (Cin x Sw x Sh)
        {
            ggml_fp16_t * const wdata = (ggml_fp16_t *) params->wdata + nk;
            for (int i12 = 0; i12 < ne12; i12++) {
                for (int i11 = 0; i11 < ne11; i11++) {
                    const float * const src = (float *)((char *) src1->data + i12*nb12 + i11*nb11);
                    ggml_fp16_t * dst_data = wdata + i11*ne10*ne12;
                    for (int i10 = 0; i10 < ne10; i10++) {
                        dst_data[i10*ne12 + i12] = GGML_FP32_TO_FP16(src[i10]);
                    }
                }
            }
        }

        memset(dst->data, 0, ggml_nbytes(dst));
    }
    ggml_barrier(params->threadpool);

    const int32_t stride = ggml_get_op_params_i32(dst, 0);

    // total patches in dst
    const int np = ne2;

    // patches per thread
    const int dp = (np + nth - 1)/nth;

    // patch range for this thread
    const int ip0 = dp*ith;
    const int ip1 = MIN(ip0 + dp, np);

    ggml_fp16_t * const wdata = (ggml_fp16_t *) params->wdata + 0;
    ggml_fp16_t * const wdata_src = wdata + nk;

    for (int i2 = ip0; i2 < ip1; i2++) { // Cout
        float * dst_data = (float *)((char *) dst->data + i2*nb2);
        ggml_fp16_t * wdata_kernel = wdata + i2*ne01*ne00*ne03;
        for (int i11 = 0; i11 < ne11; i11++) {
            for (int i10 = 0; i10 < ne10; i10++) {
                const int i1n = i11*ne10*ne12 + i10*ne12;
                for (int i01 = 0; i01 < ne01; i01++) {
                    for (int i00 = 0; i00 < ne00; i00++) {
                        float v = 0;
                        ggml_vec_dot_f16(ne03, &v, 0,
                                wdata_src + i1n, 0,
                                wdata_kernel + i01*ne00*ne03 + i00*ne03, 0, 1);
                        dst_data[(i11*stride + i01)*ne0 + i10*stride + i00] += v;
                    }
                }
            }
        }
    }
}